

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
 deqp::gls::BuiltinPrecisionTests::
 createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cross>(void)

{
  _func_int **pp_Var1;
  Cross *pCVar2;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pFVar3;
  SharedPtrStateBase *extraout_RDX;
  SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *in_RDI;
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  SVar4;
  
  pp_Var1 = (_func_int **)operator_new(0x10);
  pCVar2 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Cross>();
  *pp_Var1 = (_func_int *)&PTR__CaseFactory_021837c0;
  pp_Var1[1] = (_func_int *)pCVar2;
  in_RDI->m_func =
       (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
        *)0x0;
  (in_RDI->super_CaseFactory)._vptr_CaseFactory = pp_Var1;
  pFVar3 = (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *)operator_new(0x20);
  *(undefined4 *)&pFVar3[1].super_FuncBase._vptr_FuncBase = 0;
  *(undefined4 *)((long)&pFVar3[1].super_FuncBase._vptr_FuncBase + 4) = 0;
  (pFVar3->super_FuncBase)._vptr_FuncBase = (_func_int **)&PTR__SharedPtrState_02183810;
  pFVar3[2].super_FuncBase._vptr_FuncBase = pp_Var1;
  in_RDI->m_func = pFVar3;
  *(undefined4 *)&pFVar3[1].super_FuncBase._vptr_FuncBase = 1;
  *(undefined4 *)((long)&pFVar3[1].super_FuncBase._vptr_FuncBase + 4) = 1;
  SVar4.m_state = extraout_RDX;
  SVar4.m_ptr = in_RDI;
  return SVar4;
}

Assistant:

SharedPtr<SimpleFuncCaseFactory<typename F::Sig> > createSimpleFuncCaseFactory (void)
{
	return SharedPtr<SimpleFuncCaseFactory<typename F::Sig> >(
		new SimpleFuncCaseFactory<typename F::Sig>(instance<F>()));
}